

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O3

void __thiscall HPreData::printSolution(HPreData *this)

{
  ostream *poVar1;
  size_t sVar2;
  long *plVar3;
  ulong uVar4;
  char buff [10];
  char local_3a [10];
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Col value: ",0xb);
  if (0 < this->numColOriginal) {
    uVar4 = 0;
    do {
      sprintf(local_3a,"%2.2f ",
              (this->valuePrimal).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar2 = strlen(local_3a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_3a,sVar2);
      if ((int)((uVar4 & 0xffffffff) / 0x1e) * -0x1e + (int)uVar4 == 0) {
        std::ostream::flush();
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)this->numColOriginal);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void HPreData::printSolution() {
	char buff [10];
    cout<<endl<<"Col value: ";
    for (int i=0;i<numColOriginal;i++) {
    	sprintf(buff, "%2.2f ", valuePrimal[i]);
    	cout<<setw(5)<<buff;
    	if ((i%30) == 0)
    		cout<<std::flush;
    	}

    cout<<endl<<endl;
}